

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::analyze_instructions(Impl *this,Function *func)

{
  BasicBlock *pBVar1;
  pointer ppIVar2;
  pointer ppBVar3;
  pointer ppBVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  __normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
  _Var8;
  IteratorAdaptor<LLVMBC::BasicBlock,___gnu_cxx::__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>_>
  IVar9;
  __normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
  _Var10;
  IteratorAdaptor<LLVMBC::Instruction,___gnu_cxx::__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>_>
  IVar11;
  Instruction *pIVar12;
  LoadInst *inst;
  PHINode *inst_00;
  StoreInst *inst_01;
  AtomicRMWInst *inst_02;
  AtomicCmpXchgInst *inst_03;
  AllocaInst *inst_04;
  GetElementPtrInst *inst_05;
  ExtractValueInst *inst_06;
  CmpInst *inst_07;
  CallInst *pCVar13;
  Function *pFVar14;
  String *pSVar15;
  pointer ppBVar16;
  Type *pTVar17;
  pointer ppIVar18;
  __node_base *p_Var19;
  BasicBlock *__range2;
  pointer ppBVar20;
  Vector<const_LLVMBC::Instruction_*> precise_instructions;
  Vector<LLVMBC::BasicBlock_*> visit_order;
  BasicBlock *pBStack_38;
  
  if (((func != (Function *)0x0) && ((this->options).propagate_precise == true)) &&
     ((this->options).force_precise == false)) {
    precise_instructions.
    super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    precise_instructions.
    super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    precise_instructions.
    super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var8._M_current = (BasicBlock **)LLVMBC::Function::begin(func);
    IVar9 = LLVMBC::Function::end(func);
    for (; ppIVar2 = precise_instructions.
                     super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
        (__normal_iterator<LLVMBC::BasicBlock_*const_*,_std::vector<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>_>
         )_Var8._M_current != IVar9.iter._M_current; _Var8._M_current = _Var8._M_current + 1) {
      pBVar1 = *_Var8._M_current;
      _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
      IVar11 = LLVMBC::BasicBlock::end(pBVar1);
      for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
              )_Var10._M_current != IVar11.iter._M_current;
          _Var10._M_current = _Var10._M_current + 1) {
        pIVar12 = *_Var10._M_current;
        bVar5 = instruction_requires_no_contraction(pIVar12);
        if (bVar5) {
          visit_order.
          super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar12;
          std::
          vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
          ::emplace_back<LLVMBC::Instruction_const*>
                    ((vector<LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>>
                      *)&precise_instructions,(Instruction **)&visit_order);
        }
      }
    }
    visit_order.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = &pBStack_38;
    visit_order.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    visit_order.
    super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBStack_38 = (BasicBlock *)0x0;
    for (ppIVar18 = precise_instructions.
                    super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar18 != ppIVar2;
        ppIVar18 = ppIVar18 + 1) {
      propagate_precise((UnorderedSet<const_LLVMBC::Instruction_*> *)&visit_order,*ppIVar18);
    }
    std::
    _Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visit_order);
    std::
    _Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
    ::~_Vector_base(&precise_instructions.
                     super__Vector_base<const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>_>
                   );
  }
  build_function_bb_visit_order_analysis(&visit_order,this,func);
  ppBVar3 = visit_order.
            super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar20 = visit_order.
                  super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppBVar4 = visit_order.
                super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      ppBVar16 = visit_order.
                 super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start, ppBVar20 != ppBVar3;
      ppBVar20 = ppBVar20 + 1) {
    pBVar1 = *ppBVar20;
    if ((this->options).eliminate_dead_code == true) {
      pIVar12 = LLVMBC::BasicBlock::getTerminator(pBVar1);
      mark_used_values(this,pIVar12);
    }
    _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
    IVar11 = LLVMBC::BasicBlock::end(pBVar1);
    for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
            )_Var10._M_current != IVar11.iter._M_current; _Var10._M_current = _Var10._M_current + 1)
    {
      pIVar12 = *_Var10._M_current;
      if ((this->options).eliminate_dead_code == true) {
        mark_used_values(this,pIVar12);
      }
      inst = LLVMBC::dyn_cast<LLVMBC::LoadInst>(&pIVar12->super_Value);
      if (inst == (LoadInst *)0x0) {
        inst_00 = LLVMBC::dyn_cast<LLVMBC::PHINode>(&pIVar12->super_Value);
        if (inst_00 != (PHINode *)0x0) {
          bVar5 = analyze_phi_instruction(this,inst_00);
          goto LAB_0011e1c8;
        }
        inst_01 = LLVMBC::dyn_cast<LLVMBC::StoreInst>(&pIVar12->super_Value);
        if (inst_01 != (StoreInst *)0x0) {
          bVar5 = analyze_store_instruction(this,inst_01);
          goto LAB_0011e1c8;
        }
        inst_02 = LLVMBC::dyn_cast<LLVMBC::AtomicRMWInst>(&pIVar12->super_Value);
        if (inst_02 != (AtomicRMWInst *)0x0) {
          bVar5 = analyze_atomicrmw_instruction(this,inst_02);
          goto LAB_0011e1c8;
        }
        inst_03 = LLVMBC::dyn_cast<LLVMBC::AtomicCmpXchgInst>(&pIVar12->super_Value);
        if (inst_03 != (AtomicCmpXchgInst *)0x0) {
          bVar5 = analyze_cmpxchg_instruction(this,inst_03);
          goto LAB_0011e1c8;
        }
        inst_04 = LLVMBC::dyn_cast<LLVMBC::AllocaInst>(&pIVar12->super_Value);
        if (inst_04 != (AllocaInst *)0x0) {
          bVar5 = analyze_alloca_instruction(this,inst_04);
          goto LAB_0011e1c8;
        }
        inst_05 = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(&pIVar12->super_Value);
        if (inst_05 != (GetElementPtrInst *)0x0) {
          bVar5 = analyze_getelementptr_instruction(this,inst_05);
          goto LAB_0011e1c8;
        }
        inst_06 = LLVMBC::dyn_cast<LLVMBC::ExtractValueInst>(&pIVar12->super_Value);
        if (inst_06 != (ExtractValueInst *)0x0) {
          bVar5 = analyze_extractvalue_instruction(this,inst_06);
          goto LAB_0011e1c8;
        }
        inst_07 = LLVMBC::dyn_cast<LLVMBC::CmpInst>(&pIVar12->super_Value);
        if (inst_07 != (CmpInst *)0x0) {
          bVar5 = analyze_compare_instruction(this,inst_07);
          goto LAB_0011e1c8;
        }
        pCVar13 = LLVMBC::dyn_cast<LLVMBC::CallInst>(&pIVar12->super_Value);
        if (pCVar13 != (CallInst *)0x0) {
          pFVar14 = LLVMBC::CallInst::getCalledFunction(pCVar13);
          pSVar15 = LLVMBC::Function::getName_abi_cxx11_(pFVar14);
          iVar7 = strncmp((pSVar15->_M_dataplus)._M_p,"dx.op",5);
          if (iVar7 == 0) {
            bVar5 = analyze_dxil_instruction(this,pCVar13,pBVar1);
            goto LAB_0011e1c8;
          }
        }
      }
      else {
        bVar5 = analyze_load_instruction(this,inst);
LAB_0011e1c8:
        if (bVar5 == false) goto LAB_0011e2f7;
      }
    }
    (this->ags).current_phase = 0;
    (this->ags).num_instructions = 0;
    (this->ags).active_read_backdoor = (Value *)0x0;
  }
  for (; ppBVar16 != ppBVar4; ppBVar16 = ppBVar16 + 1) {
    pBVar1 = *ppBVar16;
    _Var10._M_current = (Instruction **)LLVMBC::BasicBlock::begin(pBVar1);
    IVar11 = LLVMBC::BasicBlock::end(pBVar1);
    for (; (__normal_iterator<LLVMBC::Instruction_*const_*,_std::vector<LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_*>_>_>
            )_Var10._M_current != IVar11.iter._M_current; _Var10._M_current = _Var10._M_current + 1)
    {
      pCVar13 = LLVMBC::dyn_cast<LLVMBC::CallInst>(&(*_Var10._M_current)->super_Value);
      if (pCVar13 != (CallInst *)0x0) {
        pFVar14 = LLVMBC::CallInst::getCalledFunction(pCVar13);
        pSVar15 = LLVMBC::Function::getName_abi_cxx11_(pFVar14);
        iVar7 = strncmp((pSVar15->_M_dataplus)._M_p,"dx.op",5);
        if ((iVar7 == 0) && (bVar5 = analyze_dxil_buffer_access_instruction(this,pCVar13), !bVar5))
        goto LAB_0011e2f7;
      }
    }
    (this->ags).current_phase = 0;
    (this->ags).num_instructions = 0;
    (this->ags).active_read_backdoor = (Value *)0x0;
  }
  p_Var19 = &(this->alloca_tracking)._M_h._M_before_begin;
  bVar5 = false;
  do {
    p_Var19 = p_Var19->_M_nxt;
    if (p_Var19 == (__node_base *)0x0) {
      std::
      _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->ags).coopmat_component_mapping._M_h);
      bVar5 = true;
      break;
    }
    pTVar17 = LLVMBC::Value::getType((Value *)p_Var19[1]._M_nxt);
    pTVar17 = LLVMBC::Type::getPointerElementType(pTVar17);
    pTVar17 = LLVMBC::Type::getArrayElementType(pTVar17);
    bVar6 = analyze_alloca_cbv_forwarding_pre_resource_emit
                      (this,pTVar17,(AllocaCBVForwardingTracking *)(p_Var19 + 2));
  } while (bVar6);
LAB_0011e2f9:
  std::_Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>::
  ~_Vector_base(&visit_order.
                 super__Vector_base<LLVMBC::BasicBlock_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BasicBlock_*>_>
               );
  return bVar5;
LAB_0011e2f7:
  bVar5 = false;
  goto LAB_0011e2f9;
}

Assistant:

bool Converter::Impl::analyze_instructions(llvm::Function *func)
{
	// Need to analyze this in two stages.
	// In the first stage, we need to analyze:
	// - Load/GetElementPtr to handle lib global variables
	// - CreateHandle family to build LLVM access handles
	// - ExtractValue to track which components are used for BufferLoad.
	// In the second phase we analyze the buffer loads and stores and figure out
	// alignments of the loads and stores. This lets us build up a list of SSBO declarations we need to
	// optimally implement the loads and stores. We need to do this late, because we depend on results
	// of ExtractValue analysis.

	if (func && options.propagate_precise && !options.force_precise)
		propagate_precise(func);

	auto visit_order = build_function_bb_visit_order_analysis(func);

	for (auto *bb : visit_order)
	{
		if (options.eliminate_dead_code)
			mark_used_values(bb->getTerminator());

		for (auto &inst : *bb)
		{
			if (options.eliminate_dead_code)
				mark_used_values(&inst);

			if (auto *load_inst = llvm::dyn_cast<llvm::LoadInst>(&inst))
			{
				if (!analyze_load_instruction(*this, load_inst))
					return false;
			}
			else if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(&inst))
			{
				if (!analyze_phi_instruction(*this, phi_inst))
					return false;
			}
			else if (auto *store_inst = llvm::dyn_cast<llvm::StoreInst>(&inst))
			{
				if (!analyze_store_instruction(*this, store_inst))
					return false;
			}
			else if (auto *atomicrmw_inst = llvm::dyn_cast<llvm::AtomicRMWInst>(&inst))
			{
				if (!analyze_atomicrmw_instruction(*this, atomicrmw_inst))
					return false;
			}
			else if (auto *cmpxchg_inst = llvm::dyn_cast<llvm::AtomicCmpXchgInst>(&inst))
			{
				if (!analyze_cmpxchg_instruction(*this, cmpxchg_inst))
					return false;
			}
			else if (auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(&inst))
			{
				if (!analyze_alloca_instruction(*this, alloca_inst))
					return false;
			}
			else if (auto *getelementptr_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(&inst))
			{
				if (!analyze_getelementptr_instruction(*this, getelementptr_inst))
					return false;
			}
			else if (auto *extractvalue_inst = llvm::dyn_cast<llvm::ExtractValueInst>(&inst))
			{
				if (!analyze_extractvalue_instruction(*this, extractvalue_inst))
					return false;
			}
			else if (auto *cmp_inst = llvm::dyn_cast<llvm::CmpInst>(&inst))
			{
				if (!analyze_compare_instruction(*this, cmp_inst))
					return false;
			}
			else if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_instruction(*this, call_inst, bb))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto *bb : visit_order)
	{
		for (auto &inst : *bb)
		{
			if (auto *call_inst = llvm::dyn_cast<llvm::CallInst>(&inst))
			{
				auto *called_function = call_inst->getCalledFunction();
				if (strncmp(called_function->getName().data(), "dx.op", 5) == 0)
				{
					if (!analyze_dxil_buffer_access_instruction(*this, call_inst))
						return false;
				}
			}
		}

		// Reset AGS tracking for every BB.
		ags.reset();
	}

	for (auto &alloc : alloca_tracking)
	{
		// Mark required resource aliases before we emit resources. Defer some work until after resource creation.
		const auto *scalar_type =
		    alloc.first->getType()->getPointerElementType()->getArrayElementType();
		if (!analyze_alloca_cbv_forwarding_pre_resource_emit(*this, scalar_type, alloc.second))
			return false;
	}

	ags.reset_analysis();

	return true;
}